

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChannelControl.cpp
# Opt level: O2

int trackerboy::ChannelControl<(trackerboy::ChType)1>::init(EVP_PKEY_CTX *ctx)

{
  ChannelState CVar1;
  ChannelState *in_RDX;
  WaveformTable *in_RSI;
  ChannelState fakeLast;
  ChannelState local_8;
  
  CVar1 = *in_RDX;
  local_8._5_3_ = CVar1._5_3_;
  local_8 = (ChannelState)
            (CONCAT26(~CVar1.frequency,
                      (int6)CONCAT44(CONCAT31(local_8._5_3_,~CVar1.panning),
                                     CONCAT13(~CVar1.timbre,CONCAT12(~CVar1.envelope,CVar1._0_2_))))
            ^ 1);
  update((IApuIo *)ctx,in_RSI,&local_8,in_RDX);
  return local_8._0_4_;
}

Assistant:

void ChannelControl<ch>::init(IApuIo &apu, WaveformTable const& waveTable, ChannelState const& state) noexcept {
    ChannelState fakeLast = state;
    fakeLast.playing = !state.playing;
    fakeLast.envelope = ~state.envelope;
    fakeLast.panning = ~state.panning;
    fakeLast.timbre = ~state.timbre;
    fakeLast.frequency = ~state.frequency;
    update(apu, waveTable, fakeLast, state);
}